

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

size_t __thiscall kws::Parser::FindArea(Parser *this,char *name,size_t startPos)

{
  string *psVar1;
  int iVar2;
  size_t pos;
  size_t sVar3;
  bool bVar4;
  string local_50;
  
  psVar1 = &this->m_BufferNoComment;
  strlen(name);
  pos = std::__cxx11::string::find((char *)psVar1,(ulong)name,startPos);
  while( true ) {
    if (pos == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    sVar3 = strlen(name);
    bVar4 = true;
    if ((psVar1->_M_dataplus)._M_p[sVar3 + pos] != ':') {
      FindNextWord_abi_cxx11_(&local_50,this,pos);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      bVar4 = iVar2 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if (bVar4) break;
    strlen(name);
    pos = std::__cxx11::string::find((char *)psVar1,(ulong)name,pos + 1);
  }
  return pos;
}

Assistant:

size_t Parser::FindArea(const char* name,size_t startPos) const
{
  size_t pos = m_BufferNoComment.find(name, startPos);
  while(pos != std::string::npos)
    {
    if(m_BufferNoComment[pos+strlen(name)]==':' || this->FindNextWord(pos) == ":")
      {
      return pos;
      }
    pos = m_BufferNoComment.find(name, pos+1);
    }
  return std::string::npos;
}